

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state,uint8_t digit)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  hugeint_t hVar3;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  hugeint_t::hugeint_t(&local_58,0);
  bVar1 = hugeint_t::operator==(&state->result,&local_58);
  bVar2 = true;
  if (((int)CONCAT71(in_register_00000031,digit) != 0) || (!bVar1)) {
    if ((uint)state->width - (uint)state->scale != (uint)state->digit_count) {
      state->digit_count = state->digit_count + 1;
      local_38.lower = 0xffffffffffffffff;
      local_38.upper = 0x7fffffffffffffff;
      hugeint_t::hugeint_t(&local_48,10);
      local_58 = hugeint_t::operator/(&local_38,&local_48);
      bVar1 = hugeint_t::operator>(&state->result,&local_58);
      if (!bVar1) {
        hugeint_t::hugeint_t(&local_38,10);
        local_58 = hugeint_t::operator*(&state->result,&local_38);
        hugeint_t::hugeint_t(&local_48,(ulong)digit);
        hVar3 = hugeint_t::operator+(&local_58,&local_48);
        (state->result).lower = hVar3.lower;
        (state->result).upper = hVar3.upper;
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (state.result == 0 && digit == 0) {
			// leading zero's don't count towards the digit count
			return true;
		}
		if (state.digit_count == state.width - state.scale) {
			// width of decimal type is exceeded!
			return false;
		}
		state.digit_count++;
		if (NEGATIVE) {
			if (state.result < (NumericLimits<typename T::StoreType>::Minimum() / 10)) {
				return false;
			}
			state.result = state.result * 10 - digit;
		} else {
			if (state.result > (NumericLimits<typename T::StoreType>::Maximum() / 10)) {
				return false;
			}
			state.result = state.result * 10 + digit;
		}
		return true;
	}